

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client_test.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Request request;
  HttpClient client;
  EventLoopGroup group;
  _Any_data local_278;
  code *local_268;
  code *local_260;
  _Any_data local_258;
  code *local_248;
  code *local_240;
  undefined1 local_230 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1e8;
  Buffer local_1b0;
  HttpClient local_190;
  EventLoopGroup local_b8;
  
  paVar1 = &local_190.host_.field_2;
  local_190.host_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"EPOLL","");
  Liby::EventLoopGroup::EventLoopGroup(&local_b8,0,&local_190.host_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.host_._M_dataplus._M_p != paVar1) {
    operator_delete(local_190.host_._M_dataplus._M_p);
  }
  local_230._0_8_ = local_230 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"www.dotamax.com","");
  Liby::http::HttpClient::HttpClient(&local_190,&local_b8,(string *)local_230);
  if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
    operator_delete((void *)local_230._0_8_);
  }
  local_230._16_8_ = 0;
  local_218._M_local_buf[0] = '\0';
  local_200 = 0;
  local_1f8._M_local_buf[0] = '\0';
  local_1e8._M_buckets = &local_1e8._M_single_bucket;
  local_1e8._M_bucket_count = 1;
  local_1e8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1e8._M_element_count = 0;
  local_1e8._M_rehash_policy._M_max_load_factor = 1.0;
  local_1e8._M_rehash_policy._M_next_resize = 0;
  local_1e8._M_single_bucket = (__node_base_ptr)0x0;
  local_1b0.buffer_ = (char *)0x0;
  local_1b0.leftIndex_ = 0;
  local_1b0.rightIndex_ = 0;
  local_1b0.capacity_ = 0;
  local_230._0_4_ = 1;
  local_230._8_8_ = &local_218;
  local_208._M_p = (pointer)&local_1f8;
  std::__cxx11::string::_M_replace((ulong)(local_230 + 8),0,(char *)0x0,0x11d036);
  local_258._M_unused._M_object = (void *)0x0;
  local_258._8_8_ = 0;
  local_240 = std::
              _Function_handler<void_(Liby::http::Reply_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/http_client_test.cpp:13:20)>
              ::_M_invoke;
  local_248 = std::
              _Function_handler<void_(Liby::http::Reply_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/http_client_test.cpp:13:20)>
              ::_M_manager;
  Liby::http::HttpClient::get(&local_190,(Request *)local_230,(ReplyHandler *)&local_258);
  if (local_248 != (code *)0x0) {
    (*local_248)(&local_258,&local_258,__destroy_functor);
  }
  local_278._M_unused._M_object = (void *)0x0;
  local_278._8_8_ = 0;
  local_260 = std::
              _Function_handler<bool_(),_Liby::EventLoopGroup::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/../src/EventLoopGroup.h:16:31)>
              ::_M_invoke;
  local_268 = std::
              _Function_handler<bool_(),_Liby::EventLoopGroup::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/../src/EventLoopGroup.h:16:31)>
              ::_M_manager;
  Liby::EventLoopGroup::run(&local_b8,(BoolFunctor *)&local_278);
  if (local_268 != (code *)0x0) {
    (*local_268)(&local_278,&local_278,__destroy_functor);
  }
  Liby::Buffer::~Buffer(&local_1b0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_p != &local_1f8) {
    operator_delete(local_208._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._8_8_ != &local_218) {
    operator_delete((void *)local_230._8_8_);
  }
  if (local_190.http_conn_.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_190.http_conn_.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_190.http_client_.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_190.http_client_.
               super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  std::__cxx11::
  _List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ::_M_clear(&local_190.sendReqeustLists_.
              super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
            );
  std::__cxx11::
  _List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ::_M_clear(&local_190.requestLists_.
              super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
            );
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_190.parser_.super_Reply.headers_._M_h);
  Liby::Buffer::~Buffer(&local_190.parser_.super_Reply.content_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.host_._M_dataplus._M_p != paVar1) {
    operator_delete(local_190.host_._M_dataplus._M_p);
  }
  Liby::EventLoopGroup::~EventLoopGroup(&local_b8);
  return 0;
}

Assistant:

int main(void) {
    EventLoopGroup group;
    HttpClient client(group, "www.dotamax.com");
    Request request;
    request.method_ = GET;
    request.uri_ = "/";
    auto handler = [](Reply &reply) {
        std::cout << reply.toString() << std::endl;
    };
    client.get(request, handler);
    group.run();
}